

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

bool gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::verifyFloatSignedNorm<signed_char>
               (GLint original_value,GLint positive_value,GLint negated_value)

{
  char *pcVar1;
  char *pcVar2;
  GLuint i;
  long lVar3;
  bool bVar4;
  GLint negated_value_local;
  GLint positive_value_local;
  
  positive_value_local = positive_value;
  negated_value_local = negated_value;
  if (original_value != positive_value) {
    return false;
  }
  lVar3 = 0;
  do {
    bVar4 = lVar3 == 4;
    if (bVar4) {
      return bVar4;
    }
    pcVar1 = (char *)((long)&positive_value_local + lVar3);
    pcVar2 = (char *)((long)&negated_value_local + lVar3);
    lVar3 = lVar3 + 1;
  } while ((int)*pcVar2 + (int)*pcVar1 == 0);
  return bVar4;
}

Assistant:

static bool verifyFloatSignedNorm(GLint original_value, GLint positive_value, GLint negated_value)
	{
		if (original_value != positive_value)
		{
			return false;
		}

		static const GLuint n_elements = sizeof(GLint) / sizeof(T); /* 1, 2, 4 */

		const T* positive_elements = (T*)&positive_value;
		const T* negated_elements  = (T*)&negated_value;

		for (GLuint i = 0; i < n_elements; ++i)
		{
			const T positive_element = positive_elements[i];
			const T negated_element  = negated_elements[i];

			/* Compare data bits */
			if (positive_element != -negated_element)
			{
				return false;
			}
		}

		return true;
	}